

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O0

LY_ERR lys_compile_feature_circular_check
                 (ly_ctx *ctx,lysp_feature *feature,lysp_feature **depfeatures)

{
  long lVar1;
  ulong local_78;
  lysp_feature *local_68;
  lysp_feature *drv;
  ly_set recursion;
  uint64_t v;
  uint64_t u;
  LY_ERR ret;
  lysp_feature **depfeatures_local;
  lysp_feature *feature_local;
  ly_ctx *ctx_local;
  
  u._4_4_ = LY_SUCCESS;
  memset(&drv,0,0x10);
  if (depfeatures == (lysp_feature **)0x0) {
    return LY_SUCCESS;
  }
  v = 0;
  while( true ) {
    if (depfeatures == (lysp_feature **)0x0) {
      local_68 = (lysp_feature *)0x0;
    }
    else {
      local_68 = depfeatures[-1];
    }
    if (local_68 <= v) break;
    if (feature == depfeatures[v]) {
      ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,"Feature \"%s\" is indirectly referenced from itself.",
              feature->name);
      u._4_4_ = LY_EVALID;
      goto LAB_0018931e;
    }
    u._4_4_ = ly_set_add((ly_set *)&drv,depfeatures[v],'\0',(uint32_t *)0x0);
    if (u._4_4_ != LY_SUCCESS) goto LAB_0018931e;
    v = v + 1;
  }
  for (recursion.field_2.dnodes = (lyd_node **)0x0;
      recursion.field_2.dnodes < (lyd_node **)(ulong)drv._4_4_;
      recursion.field_2.dnodes = recursion.field_2.dnodes + 1) {
    lVar1 = *(long *)(recursion._0_8_ + (long)recursion.field_2.dnodes * 8);
    v = 0;
    while( true ) {
      if (*(long *)(lVar1 + 0x18) == 0) {
        local_78 = 0;
      }
      else {
        local_78 = *(ulong *)(*(long *)(lVar1 + 0x18) + -8);
      }
      if (local_78 <= v) break;
      if (feature == *(lysp_feature **)(*(long *)(lVar1 + 0x18) + v * 8)) {
        ly_vlog(ctx,(char *)0x0,LYVE_REFERENCE,
                "Feature \"%s\" is indirectly referenced from itself.",feature->name);
        u._4_4_ = LY_EVALID;
        goto LAB_0018931e;
      }
      ly_set_add((ly_set *)&drv,*(void **)(*(long *)(lVar1 + 0x18) + v * 8),'\0',(uint32_t *)0x0);
      if (u._4_4_ != LY_SUCCESS) goto LAB_0018931e;
      v = v + 1;
    }
  }
LAB_0018931e:
  ly_set_erase((ly_set *)&drv,(_func_void_void_ptr *)0x0);
  return u._4_4_;
}

Assistant:

static LY_ERR
lys_compile_feature_circular_check(const struct ly_ctx *ctx, struct lysp_feature *feature, struct lysp_feature **depfeatures)
{
    LY_ERR ret = LY_SUCCESS;
    LY_ARRAY_COUNT_TYPE u, v;
    struct ly_set recursion = {0};
    struct lysp_feature *drv;

    if (!depfeatures) {
        return LY_SUCCESS;
    }

    for (u = 0; u < LY_ARRAY_COUNT(depfeatures); ++u) {
        if (feature == depfeatures[u]) {
            LOGVAL(ctx, LYVE_REFERENCE, "Feature \"%s\" is indirectly referenced from itself.", feature->name);
            ret = LY_EVALID;
            goto cleanup;
        }
        ret = ly_set_add(&recursion, depfeatures[u], 0, NULL);
        LY_CHECK_GOTO(ret, cleanup);
    }

    for (v = 0; v < recursion.count; ++v) {
        drv = recursion.objs[v];
        for (u = 0; u < LY_ARRAY_COUNT(drv->depfeatures); ++u) {
            if (feature == drv->depfeatures[u]) {
                LOGVAL(ctx, LYVE_REFERENCE, "Feature \"%s\" is indirectly referenced from itself.", feature->name);
                ret = LY_EVALID;
                goto cleanup;
            }
            ly_set_add(&recursion, drv->depfeatures[u], 0, NULL);
            LY_CHECK_GOTO(ret, cleanup);
        }
    }

cleanup:
    ly_set_erase(&recursion, NULL);
    return ret;
}